

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_pop(_glist *x,t_floatarg fvis)

{
  int iVar1;
  t_symbol *s;
  t_gotfn p_Var2;
  t_zoomfn zoommethod;
  t_floatarg fvis_local;
  _glist *x_local;
  
  iVar1 = glist_istoplevel(x);
  if ((iVar1 != 0) && (sys_zoom_open == 2)) {
    s = gensym("zoom");
    p_Var2 = zgetfn((t_pd *)x,s);
    if (p_Var2 != (t_gotfn)0x0) {
      (*p_Var2)(x,0x40000000);
    }
  }
  if ((fvis != 0.0) || (NAN(fvis))) {
    canvas_vis(x,1.0);
  }
  pd_popsym((t_pd *)x);
  canvas_resortinlets(x);
  canvas_resortoutlets(x);
  *(ushort *)&x->field_0xe8 = *(ushort *)&x->field_0xe8 & 0xfff7;
  return;
}

Assistant:

static void canvas_pop(t_canvas *x, t_floatarg fvis)
{
    if (glist_istoplevel(x) && (sys_zoom_open == 2))
    {
        t_zoomfn zoommethod = (t_zoomfn)zgetfn(&x->gl_pd, gensym("zoom"));
        if (zoommethod)
            (*zoommethod)(&x->gl_pd, (t_floatarg)2);
    }
    if (fvis != 0)
        canvas_vis(x, 1);
    pd_popsym(&x->gl_pd);
    canvas_resortinlets(x);
    canvas_resortoutlets(x);
    x->gl_loading = 0;
}